

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

char * luaT_objtypename(lua_State *L,TValue *o)

{
  uint uVar1;
  TString *key;
  TValue *pTVar2;
  Table *t;
  
  uVar1 = o->tt_;
  if (uVar1 == 0x47) {
    t = *(Table **)((o->value_).f + 0x10);
    if (t == (Table *)0x0) {
      uVar1 = 0x47;
      goto LAB_00118dae;
    }
  }
  else {
    if (uVar1 != 0x45) goto LAB_00118dae;
    t = *(Table **)((o->value_).f + 0x28);
    if (t == (Table *)0x0) {
      uVar1 = 0x45;
      goto LAB_00118dae;
    }
  }
  key = luaS_new(L,"__name");
  pTVar2 = luaH_getshortstr(t,key);
  if ((pTVar2->tt_ & 0xfU) == 4) {
    return (char *)((pTVar2->value_).f + 0x18);
  }
  uVar1 = o->tt_;
LAB_00118dae:
  return luaT_typenames_[(ulong)(uVar1 & 0xf) + 1];
}

Assistant:

const char *luaT_objtypename(lua_State *L, const TValue *o) {
    Table *mt;
    if ((ttistable(o) && (mt = hvalue(o)->metatable) != NULL) ||
        (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL)) {
        const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
        if (ttisstring(name))  /* is '__name' a string? */
            return getstr(tsvalue(name));  /* use it as type name */
    }
    return ttypename(ttnov(o));  /* else use standard type name */
}